

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

uint64_t __thiscall namedlabels::get(namedlabels *this,substring *s)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  ostream *this_00;
  undefined8 *in_RSI;
  uint64_t unaff_retaddr;
  size_t in_stack_00000008;
  char *c;
  uint64_t v;
  uint64_t hash;
  uint64_t in_stack_000001a8;
  substring *in_stack_000001b0;
  v_hashmap<substring,_unsigned_long> *in_stack_000001b8;
  char *local_28;
  
  uniform_hash(c,in_stack_00000008,unaff_retaddr);
  puVar2 = v_hashmap<substring,_unsigned_long>::get
                     (in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
  uVar1 = *puVar2;
  if (uVar1 == 0) {
    std::operator<<((ostream *)&std::cerr,"warning: missing named label \'");
    for (local_28 = (char *)*in_RSI; local_28 != (char *)in_RSI[1]; local_28 = local_28 + 1) {
      std::operator<<((ostream *)&std::cerr,*local_28);
    }
    this_00 = std::operator<<((ostream *)&std::cerr,'\'');
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return uVar1;
}

Assistant:

uint64_t get(substring& s)
  {
    uint64_t hash = uniform_hash((unsigned char*)s.begin, s.end - s.begin, 378401);
    uint64_t v = name2id.get(s, hash);
    if (v == 0)
    {
      std::cerr << "warning: missing named label '";
      for (char* c = s.begin; c != s.end; c++) std::cerr << *c;
      std::cerr << '\'' << std::endl;
    }
    return v;
  }